

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void new_msg(char *s,int num,int id)

{
  int iVar1;
  qtmsg *qt_msg;
  int id_local;
  int num_local;
  char *s_local;
  
  if (msg_hdr[num].n_msg < 500) {
    iVar1 = msg_hdr[num].n_msg;
    msg_hdr[num].n_msg = iVar1 + 1;
    curr_msg = (qtmsg *)((long)num * 0x2ee8 + 0x120628 + (long)iVar1 * 0x18);
    curr_msg->msgnum = id;
    curr_msg->delivery = s[2];
    curr_msg->size = 0;
    curr_msg->offset = 0;
  }
  else {
    fprintf(_stderr,"Too many messages in class (line %d)\nAdjust N_MSG in qtext.h and recompile.\n"
            ,(ulong)(uint)qt_line);
  }
  return;
}

Assistant:

static void new_msg(char *s, int num, int id)
{
	struct	qtmsg	*qt_msg;

	if (msg_hdr[num].n_msg >= N_MSG) {
		fprintf(stderr, OUT_OF_MESSAGES, qt_line);
	} else {
		qt_msg = &(msg_hdr[num].qt_msg[msg_hdr[num].n_msg++]);
		qt_msg->msgnum = id;
		qt_msg->delivery = s[2];
		qt_msg->offset = qt_msg->size = 0L;

		curr_msg = qt_msg;
	}
}